

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall
QFutureInterfaceBasePrivate::disconnectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  long lVar1;
  __pointer_type copy;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar5) goto LAB_003ce8a0;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this);
LAB_003ce8a0:
  lVar2 = (this->outputConnections).d.size;
  if (lVar2 != 0) {
    lVar4 = -8;
    do {
      if (lVar2 * -8 + lVar4 == -8) goto LAB_003ce8ef;
      lVar1 = lVar4 + 8;
      lVar3 = lVar4 + 8;
      lVar4 = lVar1;
    } while (*(QFutureCallOutInterface **)((long)(this->outputConnections).d.ptr + lVar3) != iface);
    if (lVar1 != -8) {
      QList<QFutureCallOutInterface_*>::removeAt(&this->outputConnections,lVar1 >> 3);
      (*iface->_vptr_QFutureCallOutInterface[3])(iface);
    }
  }
LAB_003ce8ef:
  LOCK();
  copy = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
    return;
  }
  return;
}

Assistant:

void QFutureInterfaceBasePrivate::disconnectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker lock(&m_mutex);
    const qsizetype index = outputConnections.indexOf(iface);
    if (index == -1)
        return;
    outputConnections.removeAt(index);

    iface->callOutInterfaceDisconnected();
}